

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

Vec_Ptr_t * Gia_IsoCollectCosClasses(Gia_IsoMan_t *p,int fVerbose)

{
  Gia_Man_t *p_00;
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p_01;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  uint i;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  p_01 = Vec_PtrAlloc(1000);
  iVar8 = 0;
  while ((p_00 = p->pGia, iVar8 < p_00->vCos->nSize - p_00->nRegs &&
         (pGVar4 = Gia_ManCo(p_00,iVar8), pGVar4 != (Gia_Obj_t *)0x0))) {
    piVar1 = p->pUniques;
    iVar2 = Gia_ObjId(p->pGia,pGVar4);
    if (0 < piVar1[iVar2]) {
      pVVar5 = Vec_IntAlloc(1);
      Vec_IntPush(pVVar5,iVar8);
      Vec_PtrPush(p_01,pVVar5);
    }
    iVar8 = iVar8 + 1;
  }
  uVar7 = 0;
  do {
    i = (uint)uVar7;
    if (p->vClasses->nSize <= (int)(i | 1)) {
      iVar2 = 0;
      iVar8 = p_01->nSize;
      if (p_01->nSize < 1) {
        iVar8 = 0;
      }
      for (; iVar8 != iVar2; iVar2 = iVar2 + 1) {
        pvVar6 = Vec_PtrEntry(p_01,iVar2);
        uVar7 = (ulong)*(int *)((long)pvVar6 + 4);
        qsort(*(void **)((long)pvVar6 + 8),uVar7,4,Vec_IntSortCompare1);
      }
      Vec_VecSortByFirstInt((Vec_Vec_t *)p_01,(int)uVar7);
      return p_01;
    }
    iVar8 = Vec_IntEntry(p->vClasses,i);
    uVar3 = Vec_IntEntry(p->vClasses,i | 1);
    lVar9 = (long)iVar8;
    uVar7 = 0;
    if (0 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    for (uVar10 = 0; uVar11 = uVar7, uVar7 != uVar10; uVar10 = uVar10 + 1) {
      pGVar4 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + uVar10 * 8 + lVar9 * 8 + 4));
      iVar8 = Gia_ObjIsPo(p->pGia,pGVar4);
      uVar11 = uVar10;
      if (iVar8 != 0) break;
    }
    if ((uint)uVar11 != uVar3) {
      pVVar5 = Vec_IntAlloc(8);
      while (bVar12 = uVar7 != 0, uVar7 = uVar7 - 1, bVar12) {
        pGVar4 = Gia_ManObj(p->pGia,*(int *)((long)p->pStoreW + lVar9 * 8 + 4));
        iVar8 = Gia_ObjIsPo(p->pGia,pGVar4);
        if (iVar8 != 0) {
          iVar8 = Gia_ObjCioId(pGVar4);
          Vec_IntPush(pVVar5,iVar8);
        }
        lVar9 = lVar9 + 1;
      }
      Vec_PtrPush(p_01,pVVar5);
    }
    uVar7 = (ulong)(i + 2);
  } while( true );
}

Assistant:

Vec_Ptr_t * Gia_IsoCollectCosClasses( Gia_IsoMan_t * p, int fVerbose )
{
    Vec_Ptr_t * vGroups;
    Vec_Int_t * vLevel;
    Gia_Obj_t * pObj;
    int i, k, iBegin, nSize;
    // add singletons
    vGroups = Vec_PtrAlloc( 1000 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        if ( p->pUniques[Gia_ObjId(p->pGia, pObj)] > 0 )
        {
            vLevel = Vec_IntAlloc( 1 );
            Vec_IntPush( vLevel, i );
            Vec_PtrPush( vGroups, vLevel );
        }

    // add groups
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                break;
        }
        if ( k == nSize )
            continue;
        vLevel = Vec_IntAlloc( 8 );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( Gia_ObjIsPo(p->pGia, pObj) )
                Vec_IntPush( vLevel, Gia_ObjCioId(pObj) );
        }
        Vec_PtrPush( vGroups, vLevel );
    }
    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vGroups, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vGroups, 0 );
//    Vec_VecFree( (Vec_Vec_t *)vGroups );
//    return NULL;
    return vGroups;
}